

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

int flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>::
    KeyCompare<unsigned_short>(void *ap,void *bp)

{
  int iVar1;
  
  iVar1 = MyGame::Example::Stat::KeyCompareWithValue((Stat *)((ulong)*bp + (long)bp),*ap);
  return -iVar1;
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }